

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::get_string(string_t *__return_storage_ptr__,lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nptr;
  byte bVar1;
  lexer_char_t *plVar2;
  uchar *puVar3;
  ulong codepoint1;
  ulong codepoint2;
  invalid_argument *this_00;
  uchar *puVar4;
  uchar *puVar5;
  long lVar6;
  string_t local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if ((long)this->m_cursor - (long)this->m_start < 2) {
    __assert_fail("m_cursor - m_start >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kesisoundusc[P]kubernetesslackbot/./json.hpp"
                  ,0x2ae1,
                  "string_t nlohmann::basic_json<>::lexer::get_string() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  puVar5 = this->m_start;
  plVar2 = this->m_cursor;
  do {
    puVar4 = puVar5 + 1;
    if (plVar2 + -1 <= puVar4) {
      return __return_storage_ptr__;
    }
    local_58._M_dataplus._M_p._0_1_ = 0x5c;
    puVar3 = std::__find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (puVar4,plVar2 + -1,&local_58);
    if (puVar3 != puVar4) {
      if (puVar4 < puVar3) {
        lVar6 = 0;
        do {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          lVar6 = lVar6 + 1;
        } while ((long)puVar3 - (long)puVar4 != lVar6);
      }
      puVar4 = puVar3 + -1;
      goto switchD_001172a6_caseD_6f;
    }
    puVar4 = puVar5 + 2;
    bVar1 = puVar5[2];
    if (bVar1 < 0x62) {
      if (((bVar1 == 0x22) || (bVar1 == 0x2f)) || (bVar1 == 0x5c)) goto LAB_00117393;
      goto switchD_001172a6_caseD_6f;
    }
    switch(bVar1) {
    case 0x6e:
      goto LAB_00117393;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      break;
    case 0x72:
      goto LAB_00117393;
    case 0x74:
LAB_00117393:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      break;
    case 0x75:
      __nptr = &local_58.field_2;
      local_58.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar5 + 3);
      local_58._M_string_length = 4;
      local_58.field_2._M_local_buf[4] = '\0';
      local_58._M_dataplus._M_p = (pointer)__nptr;
      codepoint1 = strtoul(__nptr->_M_local_buf,(char **)0x0,0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != __nptr) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((codepoint1 & 0xfffffffffffffc00) == 0xd800) {
        if (((this->m_limit <= puVar5 + 8) || (puVar5[7] != '\\')) || (puVar5[8] != 'u')) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_00,"missing low surrogate");
          goto LAB_001174b1;
        }
        local_58.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)(puVar5 + 9);
        local_58._M_string_length = 4;
        local_58.field_2._M_local_buf[4] = '\0';
        local_58._M_dataplus._M_p = (pointer)__nptr;
        codepoint2 = strtoul(__nptr->_M_local_buf,(char **)0x0,0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != __nptr) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        to_unicode(&local_58,codepoint1,codepoint2);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != __nptr) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        puVar4 = puVar5 + 0xc;
      }
      else {
        if ((codepoint1 & 0xfffffffffffffc00) == 0xdc00) {
          this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(this_00,"missing high surrogate");
LAB_001174b1:
          __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        to_unicode(&local_58,codepoint1,0);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != __nptr) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        puVar4 = puVar5 + 6;
      }
      break;
    default:
      if ((bVar1 == 0x62) || (bVar1 == 0x66)) goto LAB_00117393;
    }
switchD_001172a6_caseD_6f:
    puVar5 = puVar4;
    plVar2 = this->m_cursor;
  } while( true );
}

Assistant:

string_t get_string() const
        {
            assert(m_cursor - m_start >= 2);

            string_t result;
            result.reserve(static_cast<size_t>(m_cursor - m_start - 2));

            // iterate the result between the quotes
            for (const lexer_char_t* i = m_start + 1; i < m_cursor - 1; ++i)
            {
                // find next escape character
                auto e = std::find(i, m_cursor - 1, '\\');
                if (e != i)
                {
                    // see https://github.com/nlohmann/json/issues/365#issuecomment-262874705
                    for (auto k = i; k < e; k++)
                    {
                        result.push_back(static_cast<typename string_t::value_type>(*k));
                    }
                    i = e - 1; // -1 because of ++i
                }
                else
                {
                    // processing escaped character
                    // read next character
                    ++i;

                    switch (*i)
                    {
                        // the default escapes
                        case 't':
                        {
                            result += "\t";
                            break;
                        }
                        case 'b':
                        {
                            result += "\b";
                            break;
                        }
                        case 'f':
                        {
                            result += "\f";
                            break;
                        }
                        case 'n':
                        {
                            result += "\n";
                            break;
                        }
                        case 'r':
                        {
                            result += "\r";
                            break;
                        }
                        case '\\':
                        {
                            result += "\\";
                            break;
                        }
                        case '/':
                        {
                            result += "/";
                            break;
                        }
                        case '"':
                        {
                            result += "\"";
                            break;
                        }

                        // unicode
                        case 'u':
                        {
                            // get code xxxx from uxxxx
                            auto codepoint = std::strtoul(std::string(reinterpret_cast<typename string_t::const_pointer>(i + 1),
                                                          4).c_str(), nullptr, 16);

                            // check if codepoint is a high surrogate
                            if (codepoint >= 0xD800 and codepoint <= 0xDBFF)
                            {
                                // make sure there is a subsequent unicode
                                if ((i + 6 >= m_limit) or * (i + 5) != '\\' or * (i + 6) != 'u')
                                {
                                    JSON_THROW(std::invalid_argument("missing low surrogate"));
                                }

                                // get code yyyy from uxxxx\uyyyy
                                auto codepoint2 = std::strtoul(std::string(reinterpret_cast<typename string_t::const_pointer>
                                                               (i + 7), 4).c_str(), nullptr, 16);
                                result += to_unicode(codepoint, codepoint2);
                                // skip the next 10 characters (xxxx\uyyyy)
                                i += 10;
                            }
                            else if (codepoint >= 0xDC00 and codepoint <= 0xDFFF)
                            {
                                // we found a lone low surrogate
                                JSON_THROW(std::invalid_argument("missing high surrogate"));
                            }
                            else
                            {
                                // add unicode character(s)
                                result += to_unicode(codepoint);
                                // skip the next four characters (xxxx)
                                i += 4;
                            }
                            break;
                        }
                    }
                }
            }

            return result;
        }